

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void disas_shift_mem(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  int iVar1;
  TCGContext_conflict2 *tcg_ctx;
  TCGContext_conflict2 *s_00;
  TCGv_i32 pTVar2;
  TCGTemp *pTVar3;
  uintptr_t o_4;
  uintptr_t o_2;
  TCGv_i32 ret;
  int reg0;
  uintptr_t o_1;
  int mode;
  uint mode_00;
  TCGv_i32 addr;
  
  tcg_ctx = s->uc->tcg_ctx;
  mode_00 = insn >> 3 & 7;
  pTVar2 = gen_ea_mode(env,s,mode_00,insn & 7,1,tcg_ctx->NULL_QREG,&addr,
                       ((insn & 8) == 0) + EA_LOADU,(uint)((((s->base).tb)->flags >> 0xd & 1) == 0))
  ;
  if (pTVar2 != tcg_ctx->NULL_QREG) {
    tcg_gen_op2_m68k(tcg_ctx,INDEX_op_movi_i32,(TCGArg)(QREG_CC_V + (long)tcg_ctx),0);
    if ((insn >> 8 & 1) == 0) {
      if (QREG_CC_C != pTVar2) {
        tcg_gen_op2_m68k(tcg_ctx,INDEX_op_mov_i32,(TCGArg)(QREG_CC_C + (long)tcg_ctx),
                         (TCGArg)(pTVar2 + (long)tcg_ctx));
      }
      if ((insn & 8) == 0) {
        tcg_gen_sari_i32_m68k(tcg_ctx,QREG_CC_N,pTVar2,1);
      }
      else {
        tcg_gen_shri_i32_m68k(tcg_ctx,QREG_CC_N,pTVar2,1);
      }
    }
    else {
      tcg_gen_shri_i32_m68k(tcg_ctx,QREG_CC_C,pTVar2,0xf);
      tcg_gen_shli_i32_m68k(tcg_ctx,QREG_CC_N,pTVar2,1);
      if (((insn & 8) == 0) && ((s->env->features & 1) != 0)) {
        s_00 = s->uc->tcg_ctx;
        pTVar3 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
        iVar1 = s->release_count;
        if (7 < (long)iVar1) {
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/m68k/translate.c"
                     ,0x91,"s->release_count < MAX_TO_RELEASE");
        }
        ret = (TCGv_i32)((long)pTVar3 - (long)s_00);
        s->release_count = iVar1 + 1;
        s->release[iVar1] = ret;
        tcg_gen_ext16s_i32_m68k(s_00,ret,pTVar2);
        tcg_gen_op3_m68k(tcg_ctx,INDEX_op_xor_i32,(TCGArg)(QREG_CC_V + (long)tcg_ctx),
                         (TCGArg)(QREG_CC_N + (long)tcg_ctx),(TCGArg)(ret + (long)tcg_ctx));
      }
    }
    tcg_gen_ext16s_i32_m68k(tcg_ctx,QREG_CC_N,QREG_CC_N);
    tcg_gen_andi_i32_m68k(tcg_ctx,QREG_CC_C,QREG_CC_C,1);
    if (QREG_CC_Z != QREG_CC_N) {
      tcg_gen_op2_m68k(tcg_ctx,INDEX_op_mov_i32,(TCGArg)(QREG_CC_Z + (long)tcg_ctx),
                       (TCGArg)(QREG_CC_N + (long)tcg_ctx));
    }
    if (QREG_CC_X != QREG_CC_C) {
      tcg_gen_op2_m68k(tcg_ctx,INDEX_op_mov_i32,(TCGArg)(QREG_CC_X + (long)tcg_ctx),
                       (TCGArg)(QREG_CC_C + (long)tcg_ctx));
    }
    pTVar2 = gen_ea_mode(env,s,mode_00,insn & 7,1,QREG_CC_N,&addr,EA_STORE,
                         (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
    if (pTVar2 != tcg_ctx->NULL_QREG) {
      set_cc_op(s,CC_OP_FLAGS);
      return;
    }
  }
  gen_exception(s,(s->base).pc_next,3);
  return;
}

Assistant:

DISAS_INSN(shift_mem)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int logical = insn & 8;
    int left = insn & 0x100;
    TCGv src;
    TCGv addr;

    SRC_EA(env, src, OS_WORD, !logical, &addr);
    tcg_gen_movi_i32(tcg_ctx, QREG_CC_V, 0);
    if (left) {
        tcg_gen_shri_i32(tcg_ctx, QREG_CC_C, src, 15);
        tcg_gen_shli_i32(tcg_ctx, QREG_CC_N, src, 1);

        /*
         * Note that ColdFire always clears V,
         * while M68000 sets if the most significant bit is changed at
         * any time during the shift operation
         */
        if (!logical && m68k_feature(s->env, M68K_FEATURE_M68000)) {
            src = gen_extend(s, src, OS_WORD, 1);
            tcg_gen_xor_i32(tcg_ctx, QREG_CC_V, QREG_CC_N, src);
        }
    } else {
        tcg_gen_mov_i32(tcg_ctx, QREG_CC_C, src);
        if (logical) {
            tcg_gen_shri_i32(tcg_ctx, QREG_CC_N, src, 1);
        } else {
            tcg_gen_sari_i32(tcg_ctx, QREG_CC_N, src, 1);
        }
    }

    gen_ext(tcg_ctx, QREG_CC_N, QREG_CC_N, OS_WORD, 1);
    tcg_gen_andi_i32(tcg_ctx, QREG_CC_C, QREG_CC_C, 1);
    tcg_gen_mov_i32(tcg_ctx, QREG_CC_Z, QREG_CC_N);
    tcg_gen_mov_i32(tcg_ctx, QREG_CC_X, QREG_CC_C);

    DEST_EA(env, insn, OS_WORD, QREG_CC_N, &addr);
    set_cc_op(s, CC_OP_FLAGS);
}